

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O0

void __thiscall cmInstalledFile::SetName(cmInstalledFile *this,cmMakefile *mf,string *name)

{
  cmCompiledGeneratorExpression *pcVar1;
  cmGeneratorExpression local_70 [3];
  undefined1 local_58 [8];
  cmGeneratorExpression ge;
  cmListFileBacktrace backtrace;
  string *name_local;
  cmMakefile *mf_local;
  cmInstalledFile *this_local;
  
  cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge,mf);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_58,(cmListFileBacktrace *)&ge);
  std::__cxx11::string::operator=((string *)this,(string *)name);
  cmGeneratorExpression::Parse(local_70,(string *)local_58);
  pcVar1 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::release
                     ((auto_ptr<cmCompiledGeneratorExpression> *)local_70);
  this->NameExpression = pcVar1;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_70);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_58);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge);
  return;
}

Assistant:

void cmInstalledFile::SetName(cmMakefile* mf, const std::string& name)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(&backtrace);

  this->Name = name;
  this->NameExpression = ge.Parse(name).release();
}